

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O1

void __thiscall
kj::_::TransformPromiseNodeBase::get(TransformPromiseNodeBase *this,ExceptionOrValue *output)

{
  PromiseArenaMember *node;
  Exception *exception;
  NullableValue<kj::Exception> _exception2474;
  
  (*(this->super_PromiseNode).super_PromiseArenaMember._vptr_PromiseArenaMember[5])();
  node = &((this->dependency).ptr)->super_PromiseArenaMember;
  if (node != (PromiseArenaMember *)0x0) {
    (this->dependency).ptr = (PromiseNode *)0x0;
    PromiseDisposer::dispose(node);
  }
  return;
}

Assistant:

void TransformPromiseNodeBase::get(ExceptionOrValue& output) noexcept {
  KJ_IF_SOME(exception, kj::runCatchingExceptions([&]() {
    getImpl(output);
    dropDependency();
  })) {
    output.addException(kj::mv(exception));
  }
}